

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

void __thiscall
so_5::disp::one_thread::impl::
data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::distribute(data_source_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
             *this,mbox_t *mbox)

{
  work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t> *pwVar1;
  activity_tracking_impl_t *this_00;
  __atomic_base<unsigned_long> local_70;
  id local_68;
  work_thread_activity_stats_t local_60;
  
  local_60.m_working_stats.m_count = (uint_fast64_t)stats::suffixes::agent_count();
  local_70._M_i =
       (((this->
         super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
         ).m_agents_bound)->super___atomic_base<unsigned_long>)._M_i;
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t&,so_5::stats::suffix_t,unsigned_long>
            (mbox,&(this->
                   super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
                   ).m_base_prefix,(suffix_t *)&local_60,&local_70._M_i);
  local_60.m_working_stats.m_count = (uint_fast64_t)stats::suffixes::work_thread_queue_size();
  pwVar1 = (this->
           super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
           ).m_work_thread;
  local_70._M_i =
       reuse::work_thread::demand_queue_details::
       queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>
       ::demands_count(&(pwVar1->super_activity_tracking_impl_t).
                        super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
                        .m_queue,
                       &(pwVar1->super_activity_tracking_impl_t).
                        super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
                        .m_demands_count);
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t&,so_5::stats::suffix_t,unsigned_long>
            (mbox,&(this->
                   super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
                   ).m_work_thread_prefix,(suffix_t *)&local_60,&local_70._M_i);
  local_70._M_i = (__int_type)stats::suffixes::work_thread_activity();
  this_00 = &((this->
              super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
              ).m_work_thread)->super_activity_tracking_impl_t;
  local_68._M_thread =
       (this_00->
       super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
       ).m_thread_id._M_thread;
  reuse::work_thread::details::activity_tracking_impl_t::take_activity_stats(&local_60,this_00);
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::work_thread_activity,false>::
  send<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,std::thread::id,so_5::stats::work_thread_activity_stats_t>
            (mbox,&(this->
                   super_common_data_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
                   ).m_base_prefix,(suffix_t *)&local_70,&local_68,&local_60);
  return;
}

Assistant:

virtual void
		distribute( const mbox_t & mbox )
			{
				so_5::send< stats::messages::quantity< std::size_t > >(
						mbox,
						this->m_base_prefix,
						stats::suffixes::agent_count(),
						this->m_agents_bound.load( std::memory_order_acquire ) );

				so_5::send< stats::messages::quantity< std::size_t > >(
						mbox,
						this->m_work_thread_prefix,
						stats::suffixes::work_thread_queue_size(),
						this->m_work_thread.demands_count() );

				data_source_details::track_activity( mbox, *this );
			}